

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage2RunnerNonRecursive.hpp
# Opt level: O0

void __thiscall
Centaurus::NonRecursiveReductionRunner::reduce_by_end_marker
          (NonRecursiveReductionRunner *this,CSTMarker *marker,
          vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *starts,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *values,
          vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
          *tags)

{
  ReductionListener p_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  uint64_t start;
  uint64_t end;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  semantic_value_type val;
  byte local_75;
  long new_val;
  undefined1 local_48 [4];
  int value_count;
  SymbolEntry sym;
  vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
  *tags_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *values_local;
  vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_> *starts_local;
  CSTMarker *marker_local;
  NonRecursiveReductionRunner *this_local;
  
  sym.end = (long)tags;
  iVar3 = CSTMarker::get_machine_id(marker);
  pvVar5 = std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>::back(starts);
  iVar4 = CSTMarker::get_machine_id(pvVar5);
  if (iVar3 != iVar4) {
    __assert_fail("marker.get_machine_id() == starts.back().get_machine_id()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage2RunnerNonRecursive.hpp"
                  ,0x47,
                  "void Centaurus::NonRecursiveReductionRunner::reduce_by_end_marker(const CSTMarker &, std::vector<CSTMarker> &, std::vector<semantic_value_type> &, std::vector<detail::StackEntryTag> &)"
                 );
  }
  iVar3 = CSTMarker::get_machine_id(marker);
  pvVar5 = std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>::back(starts);
  start = CSTMarker::get_offset(pvVar5);
  end = CSTMarker::get_offset(marker);
  SymbolEntry::SymbolEntry((SymbolEntry *)local_48,iVar3,start,end);
  pvVar6 = std::
           vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
           ::back((vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                   *)sym.end);
  new_val._4_4_ = *pvVar6;
  if (new_val._4_4_ < VALUE) {
    new_val._4_4_ = END_MARKER;
  }
  else {
    std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
    ::pop_back((vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                *)sym.end);
  }
  bVar2 = std::
          vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
          ::empty((vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                   *)sym.end);
  local_75 = 1;
  if (!bVar2) {
    pvVar6 = std::
             vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
             ::back((vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                     *)sym.end);
    bVar2 = detail::isValueTag(*pvVar6);
    local_75 = bVar2 ^ 0xff;
  }
  if ((local_75 & 1) == 0) {
    __assert_fail("tags.empty() || !detail::isValueTag(tags.back())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage2RunnerNonRecursive.hpp"
                  ,0x4f,
                  "void Centaurus::NonRecursiveReductionRunner::reduce_by_end_marker(const CSTMarker &, std::vector<CSTMarker> &, std::vector<semantic_value_type> &, std::vector<detail::StackEntryTag> &)"
                 );
  }
  p_Var1 = this->m_listener;
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(values);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (values,sVar7 - (long)new_val._4_4_);
  val = (*p_Var1)((SymbolEntry *)local_48,pvVar8,new_val._4_4_,this->m_listener_context);
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(values);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (values,sVar7 - (long)new_val._4_4_);
  if (this->reduction_counter != (atomic<int> *)0x0) {
    std::__atomic_base<int>::operator++(&this->reduction_counter->super___atomic_base<int>,0);
  }
  pvVar6 = std::
           vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
           ::back((vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                   *)sym.end);
  if (*pvVar6 == START_MARKER) {
    std::vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
    ::pop_back((vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                *)sym.end);
    std::vector<Centaurus::CSTMarker,_std::allocator<Centaurus::CSTMarker>_>::pop_back(starts);
    push_value(val,values,
               (vector<Centaurus::detail::StackEntryTag,_std::allocator<Centaurus::detail::StackEntryTag>_>
                *)sym.end);
    return;
  }
  __assert_fail("tags.back() == detail::StackEntryTag::START_MARKER",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/Stage2RunnerNonRecursive.hpp"
                ,0x5a,
                "void Centaurus::NonRecursiveReductionRunner::reduce_by_end_marker(const CSTMarker &, std::vector<CSTMarker> &, std::vector<semantic_value_type> &, std::vector<detail::StackEntryTag> &)"
               );
}

Assistant:

void reduce_by_end_marker(const CSTMarker& marker, std::vector<CSTMarker>& starts, std::vector<semantic_value_type>& values, std::vector<detail::StackEntryTag>& tags)
  {
    assert(marker.get_machine_id() == starts.back().get_machine_id());
    SymbolEntry sym(marker.get_machine_id(), starts.back().get_offset(), marker.get_offset());
    int value_count = static_cast<int>(tags.back());
    if (value_count < 1) {
      value_count = 0;
    } else {
      tags.pop_back();
    }
    assert(tags.empty() || !detail::isValueTag(tags.back()));
#if PYCENTAURUS
    auto new_val = m_listener(&sym, values.data(), value_count, m_listener_context);
#else
    auto new_val = m_listener(&sym, &values[values.size() - value_count], value_count, m_listener_context);
    values.resize(values.size() - value_count);
#endif
    if (reduction_counter != nullptr) {
      (*reduction_counter)++;
    }

    assert(tags.back() == detail::StackEntryTag::START_MARKER);
    tags.pop_back();
    starts.pop_back();
    push_value(new_val, values, tags);
#if PYCENTAURUS
    values.front() = 0;
#endif
  }